

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoveCardsOperationSnapshotCreator.cpp
# Opt level: O0

unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>
 __thiscall
solitaire::archivers::MoveCardsOperationSnapshotCreator::createSnapshotIfCardsMovedToOtherPile
          (MoveCardsOperationSnapshotCreator *this,
          unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>
          *destinationPileSnapshot)

{
  uint uVar1;
  pointer pSVar2;
  type pSVar3;
  unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>
  *in_RDX;
  unique_ptr<solitaire::archivers::MoveCardsOperationSnapshotCreator::Snapshot,_std::default_delete<solitaire::archivers::MoveCardsOperationSnapshotCreator::Snapshot>_>
  local_28 [2];
  unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>
  *destinationPileSnapshot_local;
  MoveCardsOperationSnapshotCreator *this_local;
  
  destinationPileSnapshot_local = destinationPileSnapshot;
  this_local = this;
  throwIfSourcePileSnapshotIsNullptr((MoveCardsOperationSnapshotCreator *)destinationPileSnapshot);
  throwIfSnapshotIsNullptr((MoveCardsOperationSnapshotCreator *)destinationPileSnapshot,in_RDX);
  pSVar2 = std::
           unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>
           ::operator->(destinationPileSnapshot + 1);
  pSVar3 = std::
           unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>
           ::operator*(in_RDX);
  uVar1 = (*pSVar2->_vptr_Snapshot[3])(pSVar2,pSVar3);
  if ((uVar1 & 1) == 0) {
    std::
    make_unique<solitaire::archivers::MoveCardsOperationSnapshotCreator::Snapshot,std::unique_ptr<solitaire::archivers::interfaces::Snapshot,std::default_delete<solitaire::archivers::interfaces::Snapshot>>,std::unique_ptr<solitaire::archivers::interfaces::Snapshot,std::default_delete<solitaire::archivers::interfaces::Snapshot>>>
              ((unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>
                *)local_28,destinationPileSnapshot + 1);
    std::
    unique_ptr<solitaire::archivers::interfaces::Snapshot,std::default_delete<solitaire::archivers::interfaces::Snapshot>>
    ::
    unique_ptr<solitaire::archivers::MoveCardsOperationSnapshotCreator::Snapshot,std::default_delete<solitaire::archivers::MoveCardsOperationSnapshotCreator::Snapshot>,void>
              ((unique_ptr<solitaire::archivers::interfaces::Snapshot,std::default_delete<solitaire::archivers::interfaces::Snapshot>>
                *)this,local_28);
    std::
    unique_ptr<solitaire::archivers::MoveCardsOperationSnapshotCreator::Snapshot,_std::default_delete<solitaire::archivers::MoveCardsOperationSnapshotCreator::Snapshot>_>
    ::~unique_ptr(local_28);
  }
  else {
    std::
    unique_ptr<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>_>
    ::operator=(destinationPileSnapshot + 1,(nullptr_t)0x0);
    std::
    unique_ptr<solitaire::archivers::interfaces::Snapshot,std::default_delete<solitaire::archivers::interfaces::Snapshot>>
    ::unique_ptr<std::default_delete<solitaire::archivers::interfaces::Snapshot>,void>
              ((unique_ptr<solitaire::archivers::interfaces::Snapshot,std::default_delete<solitaire::archivers::interfaces::Snapshot>>
                *)this,(nullptr_t)0x0);
  }
  return (__uniq_ptr_data<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>,_true,_true>
          )(__uniq_ptr_data<solitaire::archivers::interfaces::Snapshot,_std::default_delete<solitaire::archivers::interfaces::Snapshot>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<interfaces::Snapshot>
MoveCardsOperationSnapshotCreator::createSnapshotIfCardsMovedToOtherPile(
    std::unique_ptr<interfaces::Snapshot> destinationPileSnapshot)
{
    throwIfSourcePileSnapshotIsNullptr();
    throwIfSnapshotIsNullptr(destinationPileSnapshot);

    if (sourcePileSnapshot->isSnapshotOfSameObject(*destinationPileSnapshot))
    {
        sourcePileSnapshot = nullptr;
        return nullptr;
    }

    return std::make_unique<Snapshot>(
        std::move(sourcePileSnapshot), std::move(destinationPileSnapshot)
    );
}